

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void test_ecdsa_sign(void)

{
  int iVar1;
  EC_KEY *key;
  EVP_PKEY *pkey;
  EVP_MD *md;
  ptls_iovec_t signature;
  ptls_iovec_t data;
  ptls_iovec_t input;
  ptls_buffer_t sigbuf;
  uint8_t sigbuf_small [1024];
  ptls_buffer_t local_448;
  uint8_t local_428 [1024];
  
  key = EC_KEY_new_by_curve_name(0x19f);
  EC_KEY_generate_key(key);
  pkey = EVP_PKEY_new();
  EVP_PKEY_set1_EC_KEY(pkey,key);
  EC_KEY_free(key);
  local_448.base = local_428;
  local_448.off = 0;
  local_448.capacity = 0x400;
  local_448._24_8_ = (ulong)(uint)local_448._28_4_ << 0x20;
  md = EVP_sha256();
  input.len = 0xb;
  input.base = (uint8_t *)"hello world";
  iVar1 = do_sign((EVP_PKEY *)pkey,&local_448,input,(EVP_MD *)md);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c",0xa5);
  EVP_PKEY_up_ref(pkey);
  signature.len = local_448.off;
  signature.base = local_448.base;
  data.len = 0xb;
  data.base = (uint8_t *)"hello world";
  iVar1 = verify_sign(pkey,data,signature);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c",0xa7);
  ptls_buffer__release_memory(&local_448);
  local_448.off = 0;
  local_448.is_allocated = 0;
  local_448._28_4_ = 0;
  local_448.base = (uint8_t *)0x0;
  local_448.capacity = 0;
  EVP_PKEY_free(pkey);
  return;
}

Assistant:

static void test_ecdsa_sign(void)
{
    EVP_PKEY *pkey;

    { /* create pkey */
        EC_KEY *eckey = EC_KEY_new_by_curve_name(NID_X9_62_prime256v1);
        EC_KEY_generate_key(eckey);
        pkey = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pkey, eckey);
        EC_KEY_free(eckey);
    }

    const char *message = "hello world";
    ptls_buffer_t sigbuf;
    uint8_t sigbuf_small[1024];

    ptls_buffer_init(&sigbuf, sigbuf_small, sizeof(sigbuf_small));
    ok(do_sign(pkey, &sigbuf, ptls_iovec_init(message, strlen(message)), EVP_sha256()) == 0);
    EVP_PKEY_up_ref(pkey);
    ok(verify_sign(pkey, ptls_iovec_init(message, strlen(message)), ptls_iovec_init(sigbuf.base, sigbuf.off)) == 0);

    ptls_buffer_dispose(&sigbuf);
    EVP_PKEY_free(pkey);
}